

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O1

void Abc_NodeSuperChoiceCollect(Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = vLeaves->nSize;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)vLeaves->pArray[lVar3] + 0x14);
      *puVar1 = *puVar1 | 0x60;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLeaves->nSize);
  }
  vVolume->nSize = 0;
  vLeaves->nSize = 0;
  Abc_NodeSuperChoiceCollect_rec(pRoot,vLeaves,vVolume);
  if (vLeaves->nSize == iVar2) {
    if (0 < vLeaves->nSize) {
      lVar3 = 0;
      do {
        puVar1 = (uint *)((long)vLeaves->pArray[lVar3] + 0x14);
        *puVar1 = *puVar1 & 0xffffffbf;
        lVar3 = lVar3 + 1;
      } while (lVar3 < vLeaves->nSize);
    }
    if (0 < vVolume->nSize) {
      lVar3 = 0;
      do {
        puVar1 = (uint *)((long)vVolume->pArray[lVar3] + 0x14);
        *puVar1 = *puVar1 & 0xffffffbf;
        lVar3 = lVar3 + 1;
      } while (lVar3 < vVolume->nSize);
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vLeaves) == nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                ,0x1db,"void Abc_NodeSuperChoiceCollect(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NodeSuperChoiceCollect( Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    Abc_Obj_t * pObj;
    int i, nLeaves;
    nLeaves = Vec_PtrSize(vLeaves);
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkB = pObj->fMarkC = 1;
    Vec_PtrClear( vVolume );
    Vec_PtrClear( vLeaves );
    Abc_NodeSuperChoiceCollect_rec( pRoot, vLeaves, vVolume );
    assert( Vec_PtrSize(vLeaves) == nLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vVolume, pObj, i )
        pObj->fMarkC = 0;
}